

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar_analyze.cpp
# Opt level: O3

string * type2str_abi_cxx11_(string *__return_storage_ptr__,TokenType *type)

{
  TokenType TVar1;
  char *pcVar2;
  char *pcVar3;
  
  TVar1 = *type;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(TVar1) {
  case ID_TYPE:
    pcVar3 = "Identifier";
    pcVar2 = "";
    break;
  case INT_LITERAL_TYPE:
    pcVar3 = "IntLiteral";
    pcVar2 = "";
    break;
  case KEY_TYPE:
    pcVar3 = "Key";
    pcVar2 = "";
    break;
  case ASSIGN_TYPE:
    pcVar3 = "ASSIGN";
    pcVar2 = "";
    break;
  case GLT_TYPE:
    pcVar3 = "GLT";
    pcVar2 = "";
    break;
  case GLE_TYPE:
    pcVar3 = "GLE";
    pcVar2 = "";
    break;
  case PLUS_TYPE:
    pcVar3 = "Plus";
    pcVar2 = "";
    break;
  case MINUS_TYPE:
    pcVar3 = "Minus";
    pcVar2 = "";
    break;
  case STAR_TYPE:
    pcVar3 = "Star";
    pcVar2 = "";
    break;
  case SLASH_TYPE:
    pcVar3 = "Slash";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "None";
    pcVar2 = "";
    break;
  case LBRACKET_TYPE:
    pcVar3 = "LBracket";
    pcVar2 = "";
    break;
  case RBRACKET_TYPE:
    pcVar3 = "RBracket";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string type2str(const TokenType& type) {
    switch (type) {
        case ID_TYPE:
            return "Identifier";
        case INT_LITERAL_TYPE:
            return "IntLiteral";
        case ASSIGN_TYPE:
            return "ASSIGN";
        case GLT_TYPE:
            return "GLT";
        case GLE_TYPE:
            return "GLE";
        case KEY_TYPE:
            return "Key";
        case PLUS_TYPE:
            return "Plus";
        case MINUS_TYPE:
            return "Minus";
        case STAR_TYPE:
            return "Star";
        case SLASH_TYPE:
            return "Slash";
        case LBRACKET_TYPE:
            return "LBracket";
        case RBRACKET_TYPE:
            return "RBracket";
        default:
            return "None";
    }
}